

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O0

void ASDCP::JP2K::PictureDescriptorDump(PictureDescriptor *PDesc,FILE *stream)

{
  bool bVar1;
  unsigned_short i_00;
  ui16_t uVar2;
  undefined8 uVar3;
  int local_254;
  int local_250;
  i32_t i_3;
  i32_t b;
  ui16_t i_2;
  ui16_t i_1;
  char tmp_buf [512];
  ui32_t precinct_set_size;
  ui32_t i;
  FILE *stream_local;
  PictureDescriptor *PDesc_local;
  
  _precinct_set_size = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    _precinct_set_size = _stderr;
  }
  fprintf(_precinct_set_size,
          "       AspectRatio: %d/%d\n          EditRate: %d/%d\n        SampleRate: %d/%d\n       StoredWidth: %u\n      StoredHeight: %u\n             Rsize: %u\n             Xsize: %u\n             Ysize: %u\n            XOsize: %u\n            YOsize: %u\n            XTsize: %u\n            YTsize: %u\n           XTOsize: %u\n           YTOsize: %u\n ContainerDuration: %u\n"
          ,(ulong)(uint)(PDesc->AspectRatio).Numerator,(ulong)(uint)(PDesc->AspectRatio).Denominator
          ,(ulong)(uint)(PDesc->EditRate).Numerator,(ulong)(uint)(PDesc->EditRate).Denominator,
          (PDesc->SampleRate).Numerator,(PDesc->SampleRate).Denominator,PDesc->StoredWidth,
          PDesc->StoredHeight,(uint)PDesc->Rsize,PDesc->Xsize,PDesc->Ysize,PDesc->XOsize,
          PDesc->YOsize,PDesc->XTsize,PDesc->YTsize,PDesc->XTOsize,PDesc->YTOsize,
          PDesc->ContainerDuration);
  fprintf(_precinct_set_size,"-- JPEG 2000 Metadata --\n");
  fprintf(_precinct_set_size,"    ImageComponents:\n");
  fprintf(_precinct_set_size,"  bits  h-sep v-sep\n");
  tmp_buf[0x1fc] = '\0';
  tmp_buf[0x1fd] = '\0';
  tmp_buf[0x1fe] = '\0';
  tmp_buf[0x1ff] = '\0';
  for (; (uint)tmp_buf._508_4_ < (uint)PDesc->Csize && (uint)tmp_buf._508_4_ < 3;
      tmp_buf._508_4_ = tmp_buf._508_4_ + 1) {
    fprintf(_precinct_set_size,"  %4d  %5d %5d\n",
            (ulong)(PDesc->ImageComponents[(uint)tmp_buf._508_4_].Ssize + 1),
            (ulong)PDesc->ImageComponents[(uint)tmp_buf._508_4_].XRsize,
            (ulong)PDesc->ImageComponents[(uint)tmp_buf._508_4_].YRsize);
  }
  fprintf(_precinct_set_size,"               Scod: %hhu\n",(ulong)(PDesc->CodingStyleDefault).Scod);
  fprintf(_precinct_set_size,"   ProgressionOrder: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SGcod.ProgressionOrder);
  i_00 = Kumu::cp2i<unsigned_short>((PDesc->CodingStyleDefault).SGcod.NumberOfLayers);
  uVar2 = Kumu::Swap2(i_00);
  fprintf(_precinct_set_size,"     NumberOfLayers: %hd\n",(ulong)uVar2);
  fprintf(_precinct_set_size," MultiCompTransform: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SGcod.MultiCompTransform);
  fprintf(_precinct_set_size,"DecompositionLevels: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.DecompositionLevels);
  fprintf(_precinct_set_size,"     CodeblockWidth: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.CodeblockWidth);
  fprintf(_precinct_set_size,"    CodeblockHeight: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.CodeblockHeight);
  fprintf(_precinct_set_size,"     CodeblockStyle: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.CodeblockStyle);
  fprintf(_precinct_set_size,"     Transformation: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.Transformation);
  tmp_buf[0x1f8] = '\0';
  tmp_buf[0x1f9] = '\0';
  tmp_buf[0x1fa] = '\0';
  tmp_buf[0x1fb] = '\0';
  tmp_buf[0x1fc] = '\0';
  tmp_buf[0x1fd] = '\0';
  tmp_buf[0x1fe] = '\0';
  tmp_buf[0x1ff] = '\0';
  for (; (PDesc->CodingStyleDefault).SPcod.PrecinctSize[(uint)tmp_buf._508_4_] != '\0' &&
         (uint)tmp_buf._508_4_ < 0x20; tmp_buf._508_4_ = tmp_buf._508_4_ + 1) {
    tmp_buf._504_4_ = tmp_buf._504_4_ + 1;
  }
  fprintf(_precinct_set_size,"          Precincts: %u\n",(ulong)(uint)tmp_buf._504_4_);
  fprintf(_precinct_set_size,"precinct dimensions:\n");
  tmp_buf[0x1fc] = '\0';
  tmp_buf[0x1fd] = '\0';
  tmp_buf[0x1fe] = '\0';
  tmp_buf[0x1ff] = '\0';
  for (; (uint)tmp_buf._508_4_ < (uint)tmp_buf._504_4_ && (uint)tmp_buf._508_4_ < 0x20;
      tmp_buf._508_4_ = tmp_buf._508_4_ + 1) {
    fprintf(_precinct_set_size,"    %d: %d x %d\n",(ulong)(tmp_buf._508_4_ + 1),
            (ulong)(uint)s_exp_lookup
                         [(int)((PDesc->CodingStyleDefault).SPcod.PrecinctSize
                                [(uint)tmp_buf._508_4_] & 0xf)],
            (ulong)(uint)s_exp_lookup
                         [(int)(uint)(PDesc->CodingStyleDefault).SPcod.PrecinctSize
                                     [(uint)tmp_buf._508_4_] >> 4]);
  }
  fprintf(_precinct_set_size,"               Sqcd: %hhu\n",(ulong)(PDesc->QuantizationDefault).Sqcd)
  ;
  uVar3 = Kumu::bin2hex((PDesc->QuantizationDefault).SPqcd,
                        (uint)(PDesc->QuantizationDefault).SPqcdLength,(char *)&b,0x200);
  fprintf(_precinct_set_size,"              SPqcd: %s\n",uVar3);
  if ((PDesc->Profile).N != 0) {
    fprintf(_precinct_set_size,"               Profile:\n");
    for (i_3._2_2_ = 0; i_3._2_2_ < (PDesc->Profile).N; i_3._2_2_ = i_3._2_2_ + 1) {
      fprintf(_precinct_set_size,"              Pprf(%d): %hx\n",(ulong)(i_3._2_2_ + 1),
              (ulong)(PDesc->Profile).Pprf[i_3._2_2_]);
    }
  }
  if ((PDesc->CorrespondingProfile).N != 0) {
    fprintf(_precinct_set_size,"Corresponding Profile:\n");
    for (i_3._0_2_ = 0; (ushort)i_3 < (PDesc->CorrespondingProfile).N; i_3._0_2_ = (ushort)i_3 + 1)
    {
      fprintf(_precinct_set_size,"              Pcpf(%d): %hx\n",(ulong)((ushort)i_3 + 1),
              (ulong)(PDesc->CorrespondingProfile).Pcpf[(ushort)i_3]);
    }
  }
  if ((PDesc->ExtendedCapabilities).N != -1) {
    fprintf(_precinct_set_size,"Extended Capabilities: %x\n",
            (ulong)(PDesc->ExtendedCapabilities).Pcap);
    local_250 = 0;
    local_254 = 0;
    while( true ) {
      bVar1 = false;
      if (local_250 < 0x20) {
        bVar1 = local_254 < (PDesc->ExtendedCapabilities).N;
      }
      if (!bVar1) break;
      if (((PDesc->ExtendedCapabilities).Pcap >> (0x1fU - (char)local_250 & 0x1f) & 1) != 0) {
        fprintf(_precinct_set_size,"           Ccap(%d): %hx\n",(ulong)(local_250 + 1),
                (ulong)(PDesc->ExtendedCapabilities).Ccap[local_254]);
        local_254 = local_254 + 1;
      }
      local_250 = local_250 + 1;
    }
  }
  return;
}

Assistant:

void
ASDCP::JP2K::PictureDescriptorDump(const PictureDescriptor& PDesc, FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  fprintf(stream, "\
       AspectRatio: %d/%d\n\
          EditRate: %d/%d\n\
        SampleRate: %d/%d\n\
       StoredWidth: %u\n\
      StoredHeight: %u\n\
             Rsize: %u\n\
             Xsize: %u\n\
             Ysize: %u\n\
            XOsize: %u\n\
            YOsize: %u\n\
            XTsize: %u\n\
            YTsize: %u\n\
           XTOsize: %u\n\
           YTOsize: %u\n\
 ContainerDuration: %u\n",
	  PDesc.AspectRatio.Numerator, PDesc.AspectRatio.Denominator,
	  PDesc.EditRate.Numerator, PDesc.EditRate.Denominator,
	  PDesc.SampleRate.Numerator, PDesc.SampleRate.Denominator,
	  PDesc.StoredWidth,
	  PDesc.StoredHeight,
	  PDesc.Rsize,
	  PDesc.Xsize,
	  PDesc.Ysize,
	  PDesc.XOsize,
	  PDesc.YOsize,
	  PDesc.XTsize,
	  PDesc.YTsize,
	  PDesc.XTOsize,
	  PDesc.YTOsize,
	  PDesc.ContainerDuration
	  );

  fprintf(stream, "-- JPEG 2000 Metadata --\n");
  fprintf(stream, "    ImageComponents:\n");
  fprintf(stream, "  bits  h-sep v-sep\n");

  ui32_t i;
  for ( i = 0; i < PDesc.Csize && i < MaxComponents; i++ )
    {
      fprintf(stream, "  %4d  %5d %5d\n",
	      PDesc.ImageComponents[i].Ssize + 1, // See ISO 15444-1, Table A11, for the origin of '+1'
	      PDesc.ImageComponents[i].XRsize,
	      PDesc.ImageComponents[i].YRsize
	      );
    }
  
  fprintf(stream, "               Scod: %hhu\n", PDesc.CodingStyleDefault.Scod);
  fprintf(stream, "   ProgressionOrder: %hhu\n", PDesc.CodingStyleDefault.SGcod.ProgressionOrder);
  fprintf(stream, "     NumberOfLayers: %hd\n",
	  KM_i16_BE(Kumu::cp2i<ui16_t>(PDesc.CodingStyleDefault.SGcod.NumberOfLayers)));

  fprintf(stream, " MultiCompTransform: %hhu\n", PDesc.CodingStyleDefault.SGcod.MultiCompTransform);
  fprintf(stream, "DecompositionLevels: %hhu\n", PDesc.CodingStyleDefault.SPcod.DecompositionLevels);
  fprintf(stream, "     CodeblockWidth: %hhu\n", PDesc.CodingStyleDefault.SPcod.CodeblockWidth);
  fprintf(stream, "    CodeblockHeight: %hhu\n", PDesc.CodingStyleDefault.SPcod.CodeblockHeight);
  fprintf(stream, "     CodeblockStyle: %hhu\n", PDesc.CodingStyleDefault.SPcod.CodeblockStyle);
  fprintf(stream, "     Transformation: %hhu\n", PDesc.CodingStyleDefault.SPcod.Transformation);


  ui32_t precinct_set_size = 0;

  for ( i = 0; PDesc.CodingStyleDefault.SPcod.PrecinctSize[i] != 0 && i < MaxPrecincts; ++i )
    precinct_set_size++;

  fprintf(stream, "          Precincts: %u\n", precinct_set_size);
  fprintf(stream, "precinct dimensions:\n");

  for ( i = 0; i < precinct_set_size && i < MaxPrecincts; i++ )
    fprintf(stream, "    %d: %d x %d\n", i + 1,
	    s_exp_lookup[PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]&0x0f],
	    s_exp_lookup[(PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]>>4)&0x0f]
	    );

  fprintf(stream, "               Sqcd: %hhu\n", PDesc.QuantizationDefault.Sqcd);

  char tmp_buf[MaxDefaults*2];
  fprintf(stream, "              SPqcd: %s\n",
	  Kumu::bin2hex(PDesc.QuantizationDefault.SPqcd, PDesc.QuantizationDefault.SPqcdLength,
			tmp_buf, MaxDefaults*2)
	  );


  if (PDesc.Profile.N != 0) {
	  fprintf(stream, "               Profile:\n");

	  for (ui16_t i = 0; i < PDesc.Profile.N; i++) {

		  fprintf(stream, "              Pprf(%d): %hx\n", i + 1, PDesc.Profile.Pprf[i]);

	  }
  }

  if (PDesc.CorrespondingProfile.N != 0) {
	  fprintf(stream, "Corresponding Profile:\n");

	  for (ui16_t i = 0; i < PDesc.CorrespondingProfile.N; i++) {
		  fprintf(stream, "              Pcpf(%d): %hx\n", i + 1, PDesc.CorrespondingProfile.Pcpf[i]);

	  }
  }

  if (PDesc.ExtendedCapabilities.N != JP2K::NoExtendedCapabilitiesSignaled) {

	  fprintf(stream, "Extended Capabilities: %x\n", PDesc.ExtendedCapabilities.Pcap);

	  for (i32_t b = 0, i = 0; b < JP2K::MaxCapabilities && i < PDesc.ExtendedCapabilities.N; b++) {

		  if ((PDesc.ExtendedCapabilities.Pcap >> (JP2K::MaxCapabilities - b - 1)) & 0x1) {

			  fprintf(stream, "           Ccap(%d): %hx\n", b + 1, PDesc.ExtendedCapabilities.Ccap[i++]);

		  }
	  }

  }
  
}